

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_line_container.cpp
# Opt level: O0

void __thiscall LineContainer::add(LineContainer *this,ll k,ll m)

{
  bool bVar1;
  bool bVar2;
  reference pvVar3;
  ll lVar4;
  ll local_58;
  undefined1 local_38 [8];
  Line a;
  ll m_local;
  ll k_local;
  LineContainer *this_local;
  
  a.m = 100000000000000000;
  local_38 = (undefined1  [8])k;
  a.k = m;
  a.p = m;
  while( true ) {
    bVar1 = std::vector<Line,_std::allocator<Line>_>::empty
                      (&this->super_vector<Line,_std::allocator<Line>_>);
    bVar2 = false;
    if (!bVar1) {
      pvVar3 = std::vector<Line,_std::allocator<Line>_>::back
                         (&this->super_vector<Line,_std::allocator<Line>_>);
      lVar4 = isect(this,(Line *)local_38,pvVar3);
      pvVar3 = std::vector<Line,_std::allocator<Line>_>::back
                         (&this->super_vector<Line,_std::allocator<Line>_>);
      bVar2 = lVar4 <= pvVar3->p;
    }
    if (!bVar2) break;
    std::vector<Line,_std::allocator<Line>_>::pop_back
              (&this->super_vector<Line,_std::allocator<Line>_>);
  }
  bVar2 = std::vector<Line,_std::allocator<Line>_>::empty
                    (&this->super_vector<Line,_std::allocator<Line>_>);
  if (bVar2) {
    local_58 = -100000000000000000;
  }
  else {
    pvVar3 = std::vector<Line,_std::allocator<Line>_>::back
                       (&this->super_vector<Line,_std::allocator<Line>_>);
    local_58 = isect(this,(Line *)local_38,pvVar3);
  }
  a.m = local_58;
  std::vector<Line,_std::allocator<Line>_>::push_back
            (&this->super_vector<Line,_std::allocator<Line>_>,(value_type *)local_38);
  return;
}

Assistant:

void add(ll k, ll m) {
        Line a = {k,m,INF};
        while(!empty() && isect(a, back()) <= back().p) pop_back();
        a.p = empty() ? (-INF) : isect(a, back());
        push_back(a);
    }